

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

optional<pbrt::SquareMatrix<3>_> * pbrt::Inverse<3>(SquareMatrix<3> *m)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  optional<pbrt::SquareMatrix<3>_> *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  SquareMatrix<3> r;
  Float invDet;
  Float det;
  undefined4 in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  float i;
  undefined4 in_stack_fffffffffffffc30;
  float fVar7;
  undefined4 in_stack_fffffffffffffc34;
  float fVar8;
  float d;
  float in_stack_fffffffffffffc3c;
  float in_stack_fffffffffffffc40;
  float in_stack_fffffffffffffc44;
  float a;
  span<float> local_310;
  span<const_float> local_300;
  span<const_float> local_2f0;
  span<const_float> local_2e0;
  span<const_float> local_2d0;
  span<float> local_2c0;
  span<const_float> local_2b0;
  SquareMatrix<3> *in_stack_fffffffffffffd60;
  span<const_float> local_290;
  span<const_float> local_280;
  span<float> local_270;
  span<const_float> local_260;
  span<const_float> local_250;
  span<const_float> local_240;
  span<const_float> local_230;
  span<float> local_220;
  span<const_float> local_210;
  span<const_float> local_200;
  span<const_float> local_1f0;
  span<const_float> local_1e0;
  span<float> local_1d0;
  span<const_float> local_1c0;
  span<const_float> local_1b0;
  span<const_float> local_1a0;
  span<const_float> local_190;
  span<float> local_180;
  span<const_float> local_170;
  span<const_float> local_160;
  span<const_float> local_150;
  span<const_float> local_140;
  span<float> local_130;
  span<const_float> local_120;
  span<const_float> local_110;
  span<const_float> local_100;
  span<const_float> local_f0;
  span<float> local_e0;
  span<const_float> local_d0;
  span<const_float> local_c0;
  span<const_float> local_b0;
  span<const_float> local_a0;
  span<float> local_90;
  span<const_float> local_80;
  span<const_float> local_70;
  span<const_float> local_60;
  span<const_float> local_50;
  SquareMatrix<3> local_3c;
  float local_18;
  Float local_14;
  
  local_14 = Determinant<3>(in_stack_fffffffffffffd60);
  if ((local_14 != 0.0) || (NAN(local_14))) {
    local_18 = 1.0 / local_14;
    SquareMatrix<3>::SquareMatrix(&local_3c);
    d = local_18;
    local_50 = SquareMatrix<3>::operator[]
                         ((SquareMatrix<3> *)
                          CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                          in_stack_fffffffffffffc2c);
    pfVar3 = pstd::span<const_float>::operator[](&local_50,1);
    i = *pfVar3;
    local_60 = SquareMatrix<3>::operator[]
                         ((SquareMatrix<3> *)
                          CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),(int)i);
    pfVar3 = pstd::span<const_float>::operator[](&local_60,2);
    fVar7 = *pfVar3;
    local_70 = SquareMatrix<3>::operator[]
                         ((SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffffc34,fVar7),(int)i);
    pfVar3 = pstd::span<const_float>::operator[](&local_70,2);
    fVar8 = *pfVar3;
    local_80 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_80,1);
    fVar4 = DifferenceOfProducts<float,float,float,float>
                      (in_stack_fffffffffffffc44,in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c
                       ,d);
    fVar4 = d * fVar4;
    local_90 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<float>::operator[](&local_90,0);
    fVar1 = local_18;
    *pfVar3 = fVar4;
    local_a0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<const_float>::operator[](&local_a0,2);
    fVar6 = *pfVar3;
    local_b0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<const_float>::operator[](&local_b0,0);
    a = *pfVar3;
    local_c0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_c0,0);
    local_d0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_d0,2);
    fVar5 = DifferenceOfProducts<float,float,float,float>(a,fVar6,fVar4,d);
    local_e0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<float>::operator[](&local_e0,0);
    fVar2 = local_18;
    *pfVar3 = fVar1 * fVar5;
    local_f0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_f0,0);
    local_100 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_100,1);
    local_110 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_110,1);
    local_120 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_120,0);
    fVar5 = DifferenceOfProducts<float,float,float,float>(a,fVar6,fVar4,d);
    local_130 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<float>::operator[](&local_130,0);
    fVar1 = local_18;
    *pfVar3 = fVar2 * fVar5;
    local_140 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_140,2);
    local_150 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_150,1);
    local_160 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_160,1);
    local_170 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_170,2);
    fVar5 = DifferenceOfProducts<float,float,float,float>(a,fVar6,fVar4,d);
    local_180 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<float>::operator[](&local_180,1);
    fVar2 = local_18;
    *pfVar3 = fVar1 * fVar5;
    local_190 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_190,0);
    local_1a0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_1a0,2);
    local_1b0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_1b0,2);
    local_1c0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_1c0,0);
    fVar5 = DifferenceOfProducts<float,float,float,float>(a,fVar6,fVar4,d);
    local_1d0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<float>::operator[](&local_1d0,1);
    fVar1 = local_18;
    *pfVar3 = fVar2 * fVar5;
    local_1e0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_1e0,1);
    local_1f0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_1f0,0);
    local_200 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_200,0);
    local_210 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_210,1);
    fVar5 = DifferenceOfProducts<float,float,float,float>(a,fVar6,fVar4,d);
    local_220 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<float>::operator[](&local_220,1);
    fVar2 = local_18;
    *pfVar3 = fVar1 * fVar5;
    local_230 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_230,1);
    local_240 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_240,2);
    local_250 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_250,2);
    local_260 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_260,1);
    fVar5 = DifferenceOfProducts<float,float,float,float>(a,fVar6,fVar4,d);
    local_270 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<float>::operator[](&local_270,2);
    fVar1 = local_18;
    *pfVar3 = fVar2 * fVar5;
    local_280 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_280,2);
    local_290 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_290,0);
    SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[]((span<const_float> *)&stack0xfffffffffffffd60,0);
    local_2b0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_2b0,2);
    fVar5 = DifferenceOfProducts<float,float,float,float>(a,fVar6,fVar4,d);
    local_2c0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<float>::operator[](&local_2c0,2);
    fVar2 = local_18;
    *pfVar3 = fVar1 * fVar5;
    local_2d0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_2d0,0);
    local_2e0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_2e0,1);
    local_2f0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_2f0,1);
    local_300 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pstd::span<const_float>::operator[](&local_300,0);
    fVar6 = DifferenceOfProducts<float,float,float,float>(a,fVar6,fVar4,d);
    local_310 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(fVar8,fVar7),(int)i);
    pfVar3 = pstd::span<float>::operator[](&local_310,2);
    *pfVar3 = fVar2 * fVar6;
    pstd::optional<pbrt::SquareMatrix<3>_>::optional
              ((optional<pbrt::SquareMatrix<3>_> *)CONCAT44(fVar8,fVar7),
               (SquareMatrix<3> *)CONCAT44(i,in_stack_fffffffffffffc28));
  }
  else {
    memset(in_RDI,0,0x28);
    pstd::optional<pbrt::SquareMatrix<3>_>::optional(in_RDI);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU inline pstd::optional<SquareMatrix<3>> Inverse(const SquareMatrix<3> &m) {
    Float det = Determinant(m);
    if (det == 0)
        return {};
    Float invDet = 1 / det;

    SquareMatrix<3> r;

    r[0][0] = invDet * DifferenceOfProducts(m[1][1], m[2][2], m[1][2], m[2][1]);
    r[1][0] = invDet * DifferenceOfProducts(m[1][2], m[2][0], m[1][0], m[2][2]);
    r[2][0] = invDet * DifferenceOfProducts(m[1][0], m[2][1], m[1][1], m[2][0]);
    r[0][1] = invDet * DifferenceOfProducts(m[0][2], m[2][1], m[0][1], m[2][2]);
    r[1][1] = invDet * DifferenceOfProducts(m[0][0], m[2][2], m[0][2], m[2][0]);
    r[2][1] = invDet * DifferenceOfProducts(m[0][1], m[2][0], m[0][0], m[2][1]);
    r[0][2] = invDet * DifferenceOfProducts(m[0][1], m[1][2], m[0][2], m[1][1]);
    r[1][2] = invDet * DifferenceOfProducts(m[0][2], m[1][0], m[0][0], m[1][2]);
    r[2][2] = invDet * DifferenceOfProducts(m[0][0], m[1][1], m[0][1], m[1][0]);

    return r;
}